

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_common.c
# Opt level: O0

void * tree_node_next(void *Node)

{
  bool bVar1;
  tree_node *local_28;
  tree_node *parent;
  tree_node *node;
  void *Node_local;
  
  if (*(long *)((long)Node + 0x20) == 0) {
    local_28 = *(tree_node **)((long)Node + 0x10);
    parent = (tree_node *)Node;
    while( true ) {
      bVar1 = false;
      if (local_28 != (tree_node *)0x0) {
        bVar1 = local_28->rlink == parent;
      }
      if (!bVar1) break;
      parent = local_28;
      local_28 = local_28->parent;
    }
    Node_local = local_28;
  }
  else {
    Node_local = tree_node_min(*(void **)((long)Node + 0x20));
  }
  return Node_local;
}

Assistant:

void*
tree_node_next(void* Node)
{
    tree_node* node = Node;
    if (node->rlink)
	return tree_node_min(node->rlink);
    tree_node* parent = node->parent;
    while (parent && parent->rlink == node) {
	node = parent;
	parent = parent->parent;
    }
    return parent;
}